

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<bool_(const_bool_&),_chaiscript::dispatch::detail::Fun_Caller<bool,_const_bool_&>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<bool_(const_bool_&),_chaiscript::dispatch::detail::Fun_Caller<bool,_const_bool_&>_>
           *this)

{
  void *in_RDI;
  
  ~Proxy_Function_Callable_Impl
            ((Proxy_Function_Callable_Impl<bool_(const_bool_&),_chaiscript::dispatch::detail::Fun_Caller<bool,_const_bool_&>_>
              *)0x3af0d8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}